

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bellman_ford.cpp
# Opt level: O2

void updatePred(Graph *G,int *v,vector<bool,_std::allocator<bool>_> *in_R,
               vector<bool,_std::allocator<bool>_> *reached_from_node_in_U,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *pred)

{
  pointer psVar1;
  pointer psVar2;
  size_type __n;
  pointer psVar3;
  reference rVar4;
  AdjList *g;
  int local_44;
  int *local_40;
  Graph *local_38;
  
  rVar4 = std::vector<bool,_std::allocator<bool>_>::operator[](reached_from_node_in_U,(long)*v);
  *rVar4._M_p = *rVar4._M_p | rVar4._M_mask;
  psVar1 = (G->super_type).m_vertices.
           super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar2 = *(pointer *)
            ((long)&psVar1[*v].super_StoredVertex.m_out_edges.
                    super__Vector_base<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_>_>
            + 8);
  local_40 = v;
  local_38 = G;
  for (psVar3 = *(pointer *)
                 &psVar1[*v].super_StoredVertex.m_out_edges.
                  super__Vector_base<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_>_>
      ; psVar3 != psVar2; psVar3 = psVar3 + 1) {
    __n = (psVar3->super_stored_edge<unsigned_long>).m_target;
    rVar4 = std::vector<bool,_std::allocator<bool>_>::operator[](reached_from_node_in_U,__n);
    if ((*rVar4._M_p & rVar4._M_mask) == 0) {
      rVar4 = std::vector<bool,_std::allocator<bool>_>::operator[](in_R,__n);
      if ((*rVar4._M_p & rVar4._M_mask) != 0) {
        (pred->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
        super__Vector_impl_data._M_start[__n] = (long)*local_40;
      }
      local_44 = (int)__n;
      updatePred(local_38,&local_44,in_R,reached_from_node_in_U,pred);
    }
  }
  return;
}

Assistant:

inline void updatePred(const Graph& G, const int& v,
    std::vector<bool>& in_R,
    std::vector<bool>& reached_from_node_in_U,
    std::vector<unsigned long>& pred)
{ 
    reached_from_node_in_U[v] = true;
    OutEdgeIterator ei, ei_end;
    for(boost::tie(ei, ei_end) = out_edges(v, G); ei != ei_end; ++ei){
        unsigned long w = target(*ei, G);
        if (!reached_from_node_in_U[w]) { 
            if ( in_R[w] ) pred[w] = v;
            updatePred(G, w, in_R, reached_from_node_in_U, pred);
        }
    }
}